

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O1

void __thiscall TasGrid::GridFourier::loadGpuNodes<float>(GridFourier *this)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  CudaFourierData<float> *pCVar5;
  pointer piVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  vector<int,_std::allocator<int>_> num_nodes;
  Data2D<int> transpoints;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> local_60;
  long local_48;
  long local_40;
  vector<int,_std::allocator<int>_> local_38;
  
  if ((this->gpu_cachef)._M_t.
      super___uniq_ptr_impl<TasGrid::CudaFourierData<float>,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_TasGrid::CudaFourierData<float>_*,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
      .super__Head_base<0UL,_TasGrid::CudaFourierData<float>_*,_false>._M_head_impl ==
      (CudaFourierData<float> *)0x0) {
    pCVar5 = (CudaFourierData<float> *)operator_new(0x40);
    (pCVar5->real).num_entries = 0;
    (pCVar5->real).gpu_data = (float *)0x0;
    (pCVar5->imag).num_entries = 0;
    (pCVar5->imag).gpu_data = (float *)0x0;
    (pCVar5->num_nodes).num_entries = 0;
    (pCVar5->num_nodes).gpu_data = (int *)0x0;
    (pCVar5->points).num_entries = 0;
    (pCVar5->points).gpu_data = (int *)0x0;
    (this->gpu_cachef)._M_t.
    super___uniq_ptr_impl<TasGrid::CudaFourierData<float>,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaFourierData<float>_*,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
    .super__Head_base<0UL,_TasGrid::CudaFourierData<float>_*,_false>._M_head_impl = pCVar5;
  }
  if ((((this->gpu_cachef)._M_t.
        super___uniq_ptr_impl<TasGrid::CudaFourierData<float>,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_TasGrid::CudaFourierData<float>_*,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
        .super__Head_base<0UL,_TasGrid::CudaFourierData<float>_*,_false>._M_head_impl)->num_nodes).
      num_entries == 0) {
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_60,(long)(this->super_BaseCanonicalGrid).num_dimensions,
               (allocator_type *)&local_48);
    piVar1 = (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar11 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    for (piVar9 = (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar9 != piVar1; piVar9 = piVar9 + 1) {
      iVar4 = OneDimensionalMeta::getNumPoints(*piVar9,rule_fourier);
      *piVar11 = iVar4;
      piVar11 = piVar11 + 1;
    }
    GpuVector<int>::load
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaFourierData<float>,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaFourierData<float>_*,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaFourierData<float>_*,_false>._M_head_impl)->
                num_nodes,(this->super_BaseCanonicalGrid).acceleration,
               (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,
               local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    lVar12 = 0x18;
    if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar12 = 0x40;
    }
    iVar4 = *(int *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar12);
    lVar13 = (long)iVar4;
    local_40 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
    local_48 = lVar13;
    ::std::vector<int,_std::allocator<int>_>::vector(&local_38,local_40 * lVar13,&local_61);
    if (0 < iVar4) {
      lVar7 = 0;
      lVar8 = 0;
      piVar6 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
          lVar2 = *(long *)((long)&(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid + lVar12)
          ;
          lVar3 = *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions + lVar12);
          lVar10 = 0;
          piVar9 = piVar6;
          do {
            *piVar9 = *(int *)(lVar2 * lVar7 + lVar3 + lVar10 * 4);
            lVar10 = lVar10 + 1;
            piVar9 = piVar9 + local_48;
          } while (lVar10 < (this->super_BaseCanonicalGrid).num_dimensions);
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 4;
        piVar6 = piVar6 + 1;
      } while (lVar8 != lVar13);
    }
    GpuVector<int>::load
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaFourierData<float>,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaFourierData<float>_*,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaFourierData<float>_*,_false>._M_head_impl)->
                points,(this->super_BaseCanonicalGrid).acceleration,
               (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,
               local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void GridFourier::loadGpuNodes() const{
    auto& ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaFourierData<T>>();
    if (!ccache->num_nodes.empty()) return;

    std::vector<int> num_nodes(num_dimensions);
    std::transform(max_levels.begin(), max_levels.end(), num_nodes.begin(), [](int l)->int{ return OneDimensionalMeta::getNumPoints(l, rule_fourier); });
    ccache->num_nodes.load(acceleration, num_nodes);

    const MultiIndexSet &work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();
    Data2D<int> transpoints(work.getNumIndexes(), num_dimensions);
    for(int i=0; i<num_points; i++)
        for(int j=0; j<num_dimensions; j++)
            transpoints.getStrip(j)[i] = work.getIndex(i)[j];
    ccache->points.load(acceleration, transpoints.begin(), transpoints.end());
}